

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthogonal_regions.hpp
# Opt level: O0

void afsm::orthogonal::detail::invoke_nth<1ul>::
     collect_events<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
               (tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
                *regions,event_set *events)

{
  iterator __first;
  iterator __last;
  undefined1 local_50 [8];
  event_set evts;
  __tuple_element_t<1UL,_tuple<inner_state_machine<work,_inner_state_machine<on,_state_machine<ortho_sm_def,_none,_none,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<error,_inner_state_machine<on,_state_machine<ortho_sm_def,_none,_none,_afsm::detail::observer_wrapper>_>_>_>_>
  *region;
  event_set *events_local;
  tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
  *regions_local;
  
  invoke_nth<0ul>::
  collect_events<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
            (regions,events);
  evts._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               get<1ul,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::work,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>
                         (regions);
  afsm::detail::
  state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
  ::current_handled_events
            ((event_set *)local_50,
             (state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
              *)evts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __first = std::
            set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
            ::begin((event_set *)local_50);
  __last = std::
           set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
           ::end((event_set *)local_50);
  std::
  set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::insert<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
            ((set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)events,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)__first._M_node,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)__last._M_node);
  std::
  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~set((set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          *)local_50);
  return;
}

Assistant:

static void
    collect_events( Regions const& regions, event_set& events )
    {
        previous::collect_events(regions, events);
        auto const& region = ::std::get<index>(regions);
        event_set evts = region.current_handled_events();
        events.insert(evts.begin(), evts.end());
    }